

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recommend.cc
# Opt level: O1

int bf_hit(char *bf,char *line)

{
  size_t len;
  long lVar1;
  uint hashv [2];
  uint local_18 [2];
  
  len = strlen(line);
  get_hashv(line,len,local_18);
  lVar1 = 0;
  do {
    if (((byte)bf[local_18[lVar1] >> 3] >> (local_18[lVar1] & 7) & 1) == 0) {
      return 0;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return 1;
}

Assistant:

int bf_hit(char *bf, char *line)
{ unsigned i, hashv[NUM_HASHES];
  get_hashv(line,strlen(line),hashv);
  for(i=0; i<NUM_HASHES; i++)
  { if (BIT_TEST(bf,hashv[i])==0) return 0;
  }
  return 1;
}